

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type)

{
  allocator<char> local_9;
  
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::BaseType_const&)::kotlin_typename +
                         (ulong)type->base_type * 8),&local_9);
  }
  else {
    GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet(const Type &type) const {
    return IsScalar(type.base_type) ? GenTypeBasic(type.base_type)
                                    : GenTypePointer(type);
  }